

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

FunctionType * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::FunctionType,LLVMBC::LLVMContext&,LLVMBC::Type*&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
          (LLVMContext *this,LLVMContext *u,Type **u_1,
          vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *u_2)

{
  Type *return_type_;
  Type **context;
  vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> local_50;
  FunctionType *local_38;
  FunctionType *t;
  FunctionType *mem;
  vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *u_local_2;
  Type **u_local_1;
  LLVMContext *u_local;
  LLVMContext *this_local;
  
  mem = (FunctionType *)u_2;
  u_local_2 = (vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)u_1;
  u_local_1 = (Type **)u;
  u_local = this;
  local_38 = (FunctionType *)allocate(this,0x30,8);
  context = u_local_1;
  t = local_38;
  if (local_38 == (FunctionType *)0x0) {
    std::terminate();
  }
  return_type_ = (Type *)(u_local_2->
                         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
  std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::vector
            (&local_50,
             (vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)mem);
  FunctionType::FunctionType(local_38,(LLVMContext *)context,return_type_,&local_50);
  std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::~vector(&local_50);
  append_typed_destructor<LLVMBC::FunctionType>(this,local_38);
  return local_38;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}